

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cpp
# Opt level: O0

void ValidateOptions(void)

{
  ulong uVar1;
  ostream *poVar2;
  
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"error: no input file\n");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,usage);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    return;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "error: no stdlib path, which is required for now.\n");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,usage);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  exit(1);
}

Assistant:

void ValidateOptions() {
  if (g_options.input_file.empty()) {
    std::cout << "error: no input file\n" << std::endl;
    std::cout << usage << std::endl;
    std::exit(1);
  }

  if (g_options.stdlib_path.empty()) {
    std::cout << "error: no stdlib path, which is required for now.\n"
              << std::endl;
    std::cout << usage << std::endl;
    std::exit(1);
  }
}